

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O1

void handle_control_message(char *msg,char *arg)

{
  int iVar1;
  char *__s;
  char *pcVar2;
  service *psVar3;
  char *pcVar4;
  
  iVar1 = strcmp(msg,"start");
  if (iVar1 != 0) {
    iVar1 = strcmp(msg,"stop");
    if (iVar1 == 0) {
      psVar3 = service_find_by_name(arg);
      if (psVar3 != (service *)0x0) {
        service_stop(psVar3);
        return;
      }
      pcVar4 = "<3>init: no such service \'%s\'\n";
      msg = arg;
    }
    else {
      pcVar4 = "<3>init: unknown control msg \'%s\'\n";
    }
    log_write(3,pcVar4,msg);
    return;
  }
  pcVar4 = strchr(arg,0x3a);
  if (pcVar4 == (char *)0x0) {
    __s = (char *)0x0;
    pcVar2 = (char *)0x0;
    pcVar4 = arg;
  }
  else {
    __s = strdup(arg);
    pcVar2 = strchr(__s,0x3a);
    *pcVar2 = '\0';
    pcVar2 = pcVar2 + 1;
    pcVar4 = __s;
  }
  psVar3 = service_find_by_name(pcVar4);
  if (psVar3 == (service *)0x0) {
    log_write(3,"<3>init: no such service \'%s\'\n",arg);
  }
  else {
    service_start(psVar3,pcVar2);
  }
  if (__s != (char *)0x0) {
    free(__s);
    return;
  }
  return;
}

Assistant:

void handle_control_message(const char *msg, const char *arg)
{
    if (!strcmp(msg,"start")) {
        msg_start(arg);
    } else if (!strcmp(msg,"stop")) {
        msg_stop(arg);
    } else {
        ERROR("unknown control msg '%s'\n", msg);
    }
}